

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpFactory.cpp
# Opt level: O2

Op * __thiscall xercesc_4_0::OpFactory::createDotOp(OpFactory *this)

{
  Op *this_00;
  
  this_00 = (Op *)XMemory::operator_new(0x20,this->fMemoryManager);
  Op::Op(this_00,O_DOT,this->fMemoryManager);
  BaseRefVectorOf<xercesc_4_0::Op>::addElement
            (&this->fOpVector->super_BaseRefVectorOf<xercesc_4_0::Op>,this_00);
  return this_00;
}

Assistant:

Op* OpFactory::createDotOp() {

    Op* tmpOp = new (fMemoryManager) Op(Op::O_DOT, fMemoryManager);
    fOpVector->addElement(tmpOp);
    return tmpOp;
}